

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O2

void __thiscall FParser::SF_PlayerSelectedWeapon(FParser *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  undefined8 in_RAX;
  PClassActor *type;
  AInventory *pAVar4;
  PClass *pPVar5;
  char **ppcVar6;
  char *s;
  int i;
  long lVar7;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  bVar1 = CheckArgs(this,1);
  if (bVar1) {
    iVar2 = T_GetPlayerNum(this->t_argv);
    if (this->t_argc == 2) {
      uVar3 = intvalue(this->t_argv + 1);
      if (8 < uVar3) {
        s = "weaponnum out of range! %s\n";
LAB_005e7f9a:
        script_error(s,(ulong)uVar3);
        return;
      }
      type = PClass::FindActor(SF_PlayerWeapon::WeaponNames[uVar3]);
      if (type == (PClassActor *)0x0) {
        s = "incompatibility in playerweapon\n";
        goto LAB_005e7f9a;
      }
      pAVar4 = AActor::FindInventory((AActor *)(&players)[(long)iVar2 * 0x54],type,false);
      *(AInventory **)(&DAT_009ba4f8 + (long)iVar2 * 0x2a0) = pAVar4;
    }
    (this->t_return).type = 1;
    ppcVar6 = SF_PlayerWeapon::WeaponNames;
    for (lVar7 = 0; lVar7 != 9; lVar7 = lVar7 + 1) {
      pPVar5 = DObject::GetClass(*(DObject **)(&DAT_009ba4f0 + (long)iVar2 * 0x2a0));
      FName::FName((FName *)((long)&uStack_38 + 4),*ppcVar6);
      if ((pPVar5->super_PStruct).super_PNamedType.TypeName.Index == uStack_38._4_4_) {
        (this->t_return).value.i = (int)lVar7;
        return;
      }
      ppcVar6 = ppcVar6 + 1;
    }
  }
  return;
}

Assistant:

void FParser::SF_PlayerSelectedWeapon()
{
	int playernum;
	int weaponnum;


	static const char * const WeaponNames[]={
		"Fist", "Pistol", "Shotgun", "Chaingun", "RocketLauncher", 
		"PlasmaRifle", "BFG9000", "Chainsaw", "SuperShotgun" };


	if (CheckArgs(1))
	{
		playernum=T_GetPlayerNum(t_argv[0]);

		if(t_argc == 2)
		{
			weaponnum = intvalue(t_argv[1]);

			if (weaponnum<0 || weaponnum>=9)
			{
				script_error("weaponnum out of range! %s\n", weaponnum);
				return;
			}
			PClassWeapon * ti = static_cast<PClassWeapon *>(PClass::FindActor(WeaponNames[weaponnum]));
			if (!ti)
			{
				script_error("incompatibility in playerweapon\n", weaponnum);
				return;
			}

			players[playernum].PendingWeapon = (AWeapon*)players[playernum].mo->FindInventory(ti);

		} 
		t_return.type = svt_int;
		for(int i=0;i<9;i++)
		{
			if (players[playernum].ReadyWeapon->GetClass ()->TypeName == FName(WeaponNames[i]))
			{
				t_return.value.i=i;
				break;
			}
		}
	}
}